

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O0

void __thiscall
charls_jpegls_encoder::write_spiff_entry
          (charls_jpegls_encoder *this,uint32_t entry_tag,void *entry_data,
          size_t entry_data_size_bytes)

{
  bool local_29;
  size_t entry_data_size_bytes_local;
  void *entry_data_local;
  uint32_t entry_tag_local;
  charls_jpegls_encoder *this_local;
  
  local_29 = entry_data != (void *)0x0 || entry_data_size_bytes == 0;
  charls::check_argument(local_29,InvalidJlsParameters);
  charls::check_argument(entry_tag != 1,InvalidJlsParameters);
  charls::check_argument(entry_data_size_bytes < 0xfff9,invalid_argument_size);
  charls::check_operation(this->state_ == spiff_header);
  charls::jpeg_stream_writer::write_spiff_directory_entry
            (&this->writer_,entry_tag,entry_data,entry_data_size_bytes);
  return;
}

Assistant:

void write_spiff_entry(const uint32_t entry_tag, CHARLS_IN_READS_BYTES(entry_data_size_bytes) const void* entry_data,
                           const size_t entry_data_size_bytes)
    {
        check_argument(entry_data || entry_data_size_bytes == 0);
        check_argument(entry_tag != spiff_end_of_directory_entry_type);
        check_argument(entry_data_size_bytes <= 65528, jpegls_errc::invalid_argument_size);
        check_operation(state_ == state::spiff_header);

        writer_.write_spiff_directory_entry(entry_tag, entry_data, entry_data_size_bytes);
    }